

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

Variant * __thiscall Jinx::Variant::operator+=(Variant *this,Variant *right)

{
  ValueType VVar1;
  int64_t iVar2;
  double dVar3;
  String local_30;
  
  VVar1 = this->m_type;
  if (VVar1 == String) {
    GetString_abi_cxx11_(&local_30,right);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (&(this->field_1).m_string,&local_30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_30);
  }
  else if (VVar1 == Integer) {
    iVar2 = GetInteger(right);
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (&(((this->field_1).m_collection.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_M_t)._M_impl.field_0x0 + iVar2);
  }
  else if (VVar1 == Number) {
    dVar3 = GetNumber(right);
    (this->field_1).m_number = dVar3 + (this->field_1).m_number;
  }
  return this;
}

Assistant:

inline_t Variant & Variant::operator += (const Variant & right)
	{
		switch (m_type)
		{
			case ValueType::Number:
				m_number += right.GetNumber();
				break;
			case ValueType::Integer:
				m_integer += right.GetInteger();
				break;
			case ValueType::String:
				m_string += right.GetString();
				break;
			default:
				break;
		}
		return *this;
	}